

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

Matrix * MatrixAddition(Matrix *a,Matrix *b)

{
  ulong local_30;
  uint64_t index;
  Matrix *new;
  Matrix *b_local;
  Matrix *a_local;
  
  if ((a->rows == b->rows) && (a->columns == b->columns)) {
    a_local = MatrixClone(a);
    for (local_30 = 0; local_30 < a_local->rows * a_local->columns; local_30 = local_30 + 1) {
      *(longdouble *)(a_local->matrix + local_30) =
           *(longdouble *)(a_local->matrix + local_30) + *(longdouble *)(b->matrix + local_30);
    }
  }
  else {
    fprintf(_stderr,"%s: Invalid dimension (%dx%d == %dx%d)\n","MatrixAddition",(ulong)a->rows,
            (ulong)a->columns,(ulong)b->rows,b->columns);
    a_local = (Matrix *)0x0;
  }
  return a_local;
}

Assistant:

Matrix *MatrixAddition(const Matrix *a, const Matrix *b) {
#ifndef NDEBUG
  if (a->rows != b->rows || a->columns != b->columns) {
    fprintf(stderr, "%s: Invalid dimension (%dx%d == %dx%d)\n", __FUNCTION_NAME__, a->rows, a->columns, b->rows, b->columns);
    return NULL;
  }
#endif
  Matrix *new = MatrixClone(a);
  for (uint64_t index = 0; index < new->rows * new->columns; ++index) {
    new->matrix[index] += b->matrix[index];
  }
  return new;
}